

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::createContext(GlxContext *this,GlxContext *shared)

{
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  undefined8 uVar4;
  long in_RSI;
  long in_RDI;
  bool bVar5;
  GlxErrorHandler handler;
  int debug;
  int profile;
  vector<int,_std::allocator<int>_> attributes_1;
  XVisualInfo *visual;
  int i;
  GLXFBConfig *configs;
  int nbConfigs;
  GLXFBConfig *config;
  bool hasCreateContextArb;
  int minor;
  int major;
  GLXContext toShare;
  int nbVisuals;
  XVisualInfo tpl;
  XWindowAttributes windowAttributes;
  GLXFBConfig *fbconfig;
  int count;
  int attributes [4];
  uint fbConfigId;
  XVisualInfo *visualInfo;
  ContextSettings settings;
  value_type_conflict2 *in_stack_fffffffffffffda8;
  GlxErrorHandler *in_stack_fffffffffffffdb0;
  value_type_conflict2 *in_stack_fffffffffffffdb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  Display *in_stack_fffffffffffffdc8;
  GlxErrorHandler *in_stack_fffffffffffffdd0;
  bool local_1fa;
  bool local_1f9;
  value_type_conflict2 *local_1f8;
  vector<int,_std::allocator<int>_> local_190;
  long local_178;
  int local_16c;
  long local_168;
  int local_15c;
  undefined8 *local_158;
  bool local_149;
  int local_148;
  int local_144;
  value_type_conflict2 *local_140;
  undefined4 local_134;
  undefined1 local_130 [8];
  undefined8 local_128;
  undefined4 local_120;
  undefined1 local_f0 [24];
  undefined8 local_d8;
  undefined8 *local_68;
  int local_5c [3];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_3c;
  long local_38;
  undefined8 local_2c;
  undefined8 local_24;
  undefined8 local_1c;
  undefined4 local_14;
  long local_10;
  
  local_2c = *(undefined8 *)(in_RDI + 8);
  local_24 = *(undefined8 *)(in_RDI + 0x10);
  local_1c = *(undefined8 *)(in_RDI + 0x18);
  local_14 = *(undefined4 *)(in_RDI + 0x20);
  local_38 = 0;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x48) == 0) {
    iVar1 = XGetWindowAttributes
                      (*(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x38),local_f0);
    if (iVar1 == 0) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to get the window attributes");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    local_120 = *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0xe0);
    local_128 = XVisualIDFromVisual(local_d8);
    local_134 = 0;
    local_38 = XGetVisualInfo(*(undefined8 *)(in_RDI + 0x30),3,local_130,&local_134);
  }
  else {
    local_3c = 0;
    glXQueryDrawable(*(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x48),0x8013,&local_3c)
    ;
    local_5c[1] = 0x8013;
    local_5c[2] = local_3c;
    local_50 = 0;
    local_4c = 0;
    local_5c[0] = 0;
    local_68 = (undefined8 *)
               glXChooseFBConfig(*(undefined8 *)(in_RDI + 0x30),
                                 *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0xe0),local_5c + 1,
                                 local_5c);
    if (local_5c[0] == 1) {
      local_38 = glXGetVisualFromFBConfig(*(undefined8 *)(in_RDI + 0x30),*local_68);
    }
    if (local_68 != (undefined8 *)0x0) {
      XFree(local_68);
    }
  }
  if (local_38 == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to get visual info");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (local_10 == 0) {
      local_1f8 = (value_type_conflict2 *)0x0;
    }
    else {
      local_1f8 = *(value_type_conflict2 **)(local_10 + 0x40);
    }
    local_140 = local_1f8;
    local_144 = 0;
    local_148 = 0;
    iVar1 = glXQueryVersion(*(undefined8 *)(in_RDI + 0x30),&local_144,&local_148);
    if (iVar1 == 0) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,
                               "Failed to query GLX version, limited to legacy context creation");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    local_1f9 = false;
    if (sfglx_ext_ARB_create_context == 1) {
      local_1fa = 1 < local_144 || 2 < local_148;
      local_1f9 = local_1fa;
    }
    local_149 = local_1f9;
    if (local_1f9 == false) {
LAB_0019146d:
      if (*(long *)(in_RDI + 0x40) == 0) {
        *(undefined4 *)(in_RDI + 0x14) = 2;
        *(undefined4 *)(in_RDI + 0x18) = 1;
        *(undefined4 *)(in_RDI + 0x1c) = 0;
        if ((local_140 != (value_type_conflict2 *)0x0) &&
           (iVar1 = glXMakeCurrent(*(undefined8 *)(in_RDI + 0x30),0), iVar1 == 0)) {
          poVar2 = err();
          poVar2 = std::operator<<(poVar2,"Failed to deactivate shared context before sharing");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          return;
        }
        uVar4 = glXCreateContext(*(undefined8 *)(in_RDI + 0x30),local_38,local_140,1);
        *(undefined8 *)(in_RDI + 0x40) = uVar4;
      }
      if (*(long *)(in_RDI + 0x40) == 0) {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to create an OpenGL context for this window");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      XFree(local_38);
    }
    else {
      local_158 = (undefined8 *)0x0;
      local_15c = 0;
      local_168 = glXChooseFBConfig(*(undefined8 *)(in_RDI + 0x30),
                                    *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0xe0),0,&local_15c);
      for (local_16c = 0; local_168 != 0 && local_16c < local_15c; local_16c = local_16c + 1) {
        local_178 = glXGetVisualFromFBConfig
                              (*(undefined8 *)(in_RDI + 0x30),
                               *(undefined8 *)(local_168 + (long)local_16c * 8));
        if (local_178 != 0) {
          if (*(long *)(local_178 + 8) == *(long *)(local_38 + 8)) {
            local_158 = (undefined8 *)(local_168 + (long)local_16c * 8);
            XFree(local_178);
            break;
          }
          XFree(local_178);
        }
      }
      if (local_158 == (undefined8 *)0x0) {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,
                                 "Failed to get GLXFBConfig which corresponds to the window\'s visual"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      do {
        bVar5 = false;
        if ((local_158 != (undefined8 *)0x0) && (bVar5 = false, *(long *)(in_RDI + 0x40) == 0)) {
          bVar5 = *(int *)(in_RDI + 0x14) != 0;
        }
        if (!bVar5) {
          if (local_168 != 0) {
            XFree(local_168);
          }
          goto LAB_0019146d;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x191037);
        if ((1 < *(uint *)(in_RDI + 0x14)) ||
           ((*(int *)(in_RDI + 0x14) == 1 && (1 < *(uint *)(in_RDI + 0x18))))) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8);
        }
        if (sfglx_ext_ARB_create_context_profile == 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        }
        else {
          if (((*(uint *)(in_RDI + 0x1c) & 1) != 0) || ((*(uint *)(in_RDI + 0x1c) & 4) != 0)) {
            poVar2 = err();
            poVar2 = std::operator<<(poVar2,
                                     "Selecting a profile during context creation is not supported,"
                                    );
            poVar2 = std::operator<<(poVar2,"disabling comptibility and debug");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          }
          *(undefined4 *)(in_RDI + 0x1c) = 0;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffda8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffda8);
        anon_unknown.dwarf_e3828::GlxErrorHandler::GlxErrorHandler
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        if ((local_140 == (value_type_conflict2 *)0x0) ||
           (iVar1 = glXMakeCurrent(*(undefined8 *)(in_RDI + 0x30),0), iVar1 != 0)) {
          in_stack_fffffffffffffda8 = *(value_type_conflict2 **)(in_RDI + 0x30);
          in_stack_fffffffffffffdb0 = (GlxErrorHandler *)*local_158;
          in_stack_fffffffffffffdb8 = local_140;
          in_stack_fffffffffffffdc0 =
               (vector<int,_std::allocator<int>_> *)sf_ptrc_glXCreateContextAttribsARB;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_190,0);
          in_stack_fffffffffffffdc8 =
               (Display *)
               (*(code *)in_stack_fffffffffffffdc0)
                         (in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0,
                          in_stack_fffffffffffffdb8,1,pvVar3);
          *(Display **)(in_RDI + 0x40) = in_stack_fffffffffffffdc8;
          if (*(long *)(in_RDI + 0x40) == 0) {
            if (*(int *)(in_RDI + 0x1c) == 0) {
              if (*(int *)(in_RDI + 0x18) == 0) {
                *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + -1;
                *(undefined4 *)(in_RDI + 0x18) = 9;
                *(undefined4 *)(in_RDI + 0x1c) = local_1c._4_4_;
              }
              else {
                *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + -1;
                *(undefined4 *)(in_RDI + 0x1c) = local_1c._4_4_;
              }
            }
            else {
              *(undefined4 *)(in_RDI + 0x1c) = 0;
            }
          }
          bVar5 = false;
        }
        else {
          poVar2 = err();
          in_stack_fffffffffffffdd0 =
               (GlxErrorHandler *)
               std::operator<<(poVar2,"Failed to deactivate shared context before sharing");
          std::ostream::operator<<(in_stack_fffffffffffffdd0,std::endl<char,std::char_traits<char>>)
          ;
          bVar5 = true;
        }
        anon_unknown.dwarf_e3828::GlxErrorHandler::~GlxErrorHandler(in_stack_fffffffffffffdb0);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffdc0);
      } while (!bVar5);
    }
  }
  return;
}

Assistant:

void GlxContext::createContext(GlxContext* shared)
{
    // Get a working copy of the context settings
    ContextSettings settings = m_settings;

    XVisualInfo* visualInfo = NULL;

    if (m_pbuffer)
    {
        unsigned int fbConfigId = 0;

        glXQueryDrawable(m_display, m_pbuffer, GLX_FBCONFIG_ID, &fbConfigId);

        int attributes[] =
        {
            GLX_FBCONFIG_ID, static_cast<int>(fbConfigId),
            0,               0
        };

        int count = 0;
        GLXFBConfig* fbconfig = glXChooseFBConfig(m_display, DefaultScreen(m_display), attributes, &count);

        if (count == 1)
            visualInfo = glXGetVisualFromFBConfig(m_display, *fbconfig);

        if (fbconfig)
            XFree(fbconfig);
    }
    else
    {
        // Retrieve the attributes of the target window
        XWindowAttributes windowAttributes;
        if (XGetWindowAttributes(m_display, m_window, &windowAttributes) == 0)
        {
            err() << "Failed to get the window attributes" << std::endl;
            return;
        }

        // Get its visuals
        XVisualInfo tpl;
        tpl.screen   = DefaultScreen(m_display);
        tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
        int nbVisuals = 0;
        visualInfo = XGetVisualInfo(m_display, VisualIDMask | VisualScreenMask, &tpl, &nbVisuals);
    }

    if (!visualInfo)
    {
        err() << "Failed to get visual info" << std::endl;
        return;
    }

    // Get the context to share display lists with
    GLXContext toShare = shared ? shared->m_context : NULL;

    // There are no GLX versions prior to 1.0
    int major = 0;
    int minor = 0;

    if (!glXQueryVersion(m_display, &major, &minor))
        err() << "Failed to query GLX version, limited to legacy context creation" << std::endl;

    // Check if glXCreateContextAttribsARB is available (requires GLX 1.3 or greater)
    bool hasCreateContextArb = (sfglx_ext_ARB_create_context == sfglx_LOAD_SUCCEEDED) && ((major > 1) || (minor >= 3));

    // Create the OpenGL context -- first try using glXCreateContextAttribsARB
    if (hasCreateContextArb)
    {
        // Get a GLXFBConfig that matches the window's visual, for glXCreateContextAttribsARB
        GLXFBConfig* config = NULL;

        // We don't supply attributes to match against, since
        // the visual we are matching against was already
        // deemed suitable in selectBestVisual()
        int nbConfigs = 0;
        GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

        for (int i = 0; configs && (i < nbConfigs); ++i)
        {
            XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

            if (!visual)
                continue;

            if (visual->visualid == visualInfo->visualid)
            {
                config = &configs[i];
                XFree(visual);
                break;
            }

            XFree(visual);
        }

        if (!config)
            err() << "Failed to get GLXFBConfig which corresponds to the window's visual" << std::endl;

        while (config && !m_context && m_settings.majorVersion)
        {
            std::vector<int> attributes;

            // Check if the user requested a specific context version (anything > 1.1)
            if ((m_settings.majorVersion > 1) || ((m_settings.majorVersion == 1) && (m_settings.minorVersion > 1)))
            {
                attributes.push_back(GLX_CONTEXT_MAJOR_VERSION_ARB);
                attributes.push_back(m_settings.majorVersion);
                attributes.push_back(GLX_CONTEXT_MINOR_VERSION_ARB);
                attributes.push_back(m_settings.minorVersion);
            }

            // Check if setting the profile is supported
            if (sfglx_ext_ARB_create_context_profile == sfglx_LOAD_SUCCEEDED)
            {
                int profile = (m_settings.attributeFlags & ContextSettings::Core) ? GLX_CONTEXT_CORE_PROFILE_BIT_ARB : GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                int debug = (m_settings.attributeFlags & ContextSettings::Debug) ? GLX_CONTEXT_DEBUG_BIT_ARB : 0;

                attributes.push_back(GLX_CONTEXT_PROFILE_MASK_ARB);
                attributes.push_back(profile);
                attributes.push_back(GLX_CONTEXT_FLAGS_ARB);
                attributes.push_back(debug);
            }
            else
            {
                if ((m_settings.attributeFlags & ContextSettings::Core) || (m_settings.attributeFlags & ContextSettings::Debug))
                    err() << "Selecting a profile during context creation is not supported,"
                          << "disabling comptibility and debug" << std::endl;

                m_settings.attributeFlags = ContextSettings::Default;
            }

            // Append the terminating 0
            attributes.push_back(0);
            attributes.push_back(0);

            // RAII GLX error handler (we simply ignore errors here)
            // On an error, glXCreateContextAttribsARB will return 0 anyway
            GlxErrorHandler handler(m_display);

            if (toShare)
            {
                if (!glXMakeCurrent(m_display, None, NULL))
                {
                    err() << "Failed to deactivate shared context before sharing" << std::endl;
                    return;
                }
            }

            // Create the context
            m_context = glXCreateContextAttribsARB(m_display, *config, toShare, true, &attributes[0]);

            if (!m_context)
            {
                // If we couldn't create the context, first try disabling flags,
                // then lower the version number and try again -- stop at 0.0
                // Invalid version numbers will be generated by this algorithm (like 3.9), but we really don't care
                if (m_settings.attributeFlags != ContextSettings::Default)
                {
                    m_settings.attributeFlags = ContextSettings::Default;
                }
                else if (m_settings.minorVersion > 0)
                {
                    // If the minor version is not 0, we decrease it and try again
                    m_settings.minorVersion--;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
                else
                {
                    // If the minor version is 0, we decrease the major version
                    m_settings.majorVersion--;
                    m_settings.minorVersion = 9;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
            }
        }

        if (configs)
            XFree(configs);
    }

    // If glXCreateContextAttribsARB failed, use glXCreateContext
    if (!m_context)
    {
        // set the context version to 2.1 (arbitrary) and disable flags
        m_settings.majorVersion = 2;
        m_settings.minorVersion = 1;
        m_settings.attributeFlags = ContextSettings::Default;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

        if (toShare)
        {
            if (!glXMakeCurrent(m_display, None, NULL))
            {
                err() << "Failed to deactivate shared context before sharing" << std::endl;
                return;
            }
        }

        // Create the context, using the target window's visual
        m_context = glXCreateContext(m_display, visualInfo, toShare, true);

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::createContext()" << std::endl;
#endif
    }

    if (!m_context)
        err() << "Failed to create an OpenGL context for this window" << std::endl;

    // Free the visual info
    XFree(visualInfo);
}